

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O2

void cos1D_predict<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  result_type_conflict1 rVar1;
  double dVar2;
  uint uVar3;
  ostream *poVar4;
  X *src;
  XZ *pXVar5;
  long lVar6;
  int k;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  uniform_01<double,_double> uniform;
  Vec z;
  Vec x;
  vector<double,_std::allocator<double>_> invSol;
  mt19937 rng;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&rng);
  invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&z,(int *)&invSol);
  invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&x,(int *)&invSol);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "\t --- Forward Prediction (random input locations): ---");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar8 = 10;
  while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
    rVar1 = boost::random::detail::new_uniform_01<double>::operator()
                      ((new_uniform_01<double> *)&uniform,&rng);
    invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(rVar1 * 4.0 * 3.141592653589793);
    *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double)invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    src = IMLE<1,_1,_FastLinearExpert>::predict(imleObj,(Z *)&invSol);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,1,1,0,1,1>>(&x,src);
    std::operator<<((ostream *)&std::cout,"\t cos(");
    poVar4 = std::ostream::_M_insert<double>
                       (*z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data);
    std::operator<<(poVar4,") = ");
    dVar2 = cos(*z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    poVar4 = std::ostream::_M_insert<double>(dVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)&std::cout,"\tpred(");
    poVar4 = std::ostream::_M_insert<double>
                       (*z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data);
    std::operator<<(poVar4,") = ");
    poVar4 = std::ostream::_M_insert<double>
                       (*x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data);
    std::operator<<(poVar4,"  (error = ");
    dVar2 = cos(*z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    poVar4 = std::ostream::_M_insert<double>
                       (dVar2 - *x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)&std::cout,"\t\t    Jacobian(");
    poVar4 = std::ostream::_M_insert<double>
                       (*z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data);
    std::operator<<(poVar4,") = ");
    dVar2 = sin(*z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    poVar4 = std::ostream::_M_insert<double>(-dVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)&std::cout,"\t\tpredJacobian(");
    poVar4 = std::ostream::_M_insert<double>
                       (*z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data);
    std::operator<<(poVar4,") = ");
    pXVar5 = IMLE<1,_1,_FastLinearExpert>::getPredictionJacobian(imleObj);
    poVar4 = std::ostream::_M_insert<double>
                       ((pXVar5->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                        m_storage.m_data.array[0]);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "\t --- Inverse Prediction (random output locations): ---");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (iVar8 = 0; iVar8 != 10; iVar8 = iVar8 + 1) {
    rVar1 = boost::random::detail::new_uniform_01<double>::operator()
                      ((new_uniform_01<double> *)&uniform,&rng);
    dVar2 = rVar1 + rVar1 + -1.0;
    *x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = dVar2;
    dVar2 = acos(dVar2);
    invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
    IMLE<1,_1,_FastLinearExpert>::predictInverse
              (imleObj,(X *)&invSol.super__Vector_base<double,_std::allocator<double>_>);
    invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    uVar3 = imleObj->nInvSolFound;
    if (imleObj->nInvSolFound < 1) {
      uVar3 = 0;
    }
    for (lVar6 = 0; (ulong)uVar3 * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 &invSol.super__Vector_base<double,_std::allocator<double>_>,
                 (value_type_conflict *)
                 ((long)&(((imleObj->invPredictions).
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                           .
                           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage +
                 lVar6));
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::operator<<((ostream *)&std::cout,"\tinvCos(");
    poVar4 = std::ostream::_M_insert<double>
                       (*x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data);
    std::operator<<(poVar4,") = ( ");
    poVar4 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar4,", ");
    poVar4 = std::ostream::_M_insert<double>(6.283185307179586 - dVar2);
    std::operator<<(poVar4,", ");
    poVar4 = std::ostream::_M_insert<double>(dVar2 + 6.283185307179586);
    std::operator<<(poVar4,", ");
    poVar4 = std::ostream::_M_insert<double>(12.566370614359172 - dVar2);
    poVar4 = std::operator<<(poVar4," )");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)&std::cout,"\t  pred(");
    poVar4 = std::ostream::_M_insert<double>
                       (*x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data);
    std::operator<<(poVar4,") = ( ");
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      poVar4 = std::ostream::_M_insert<double>
                         (invSol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::operator<<(poVar4,", ");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&invSol.super__Vector_base<double,_std::allocator<double>_>);
  }
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void cos1D_predict( Learner &imleObj)
{
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    // Query dataset size
    const int NPOINTS_QUERY = 10;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Forward Prediction
    cout << "\t --- Forward Prediction (random input locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        z[0] = uniform(rng) * 4*M_PI;

        x = imleObj.predict(z);
        // Alternatively:
        //      imleObj.predict();
        //      x = getPrediction()[0];

        cout << "\t cos(" << z[0] << ") = " << cos(z[0]) << endl;
        cout << "\tpred(" << z[0] << ") = " << x[0] << "  (error = " << cos(z[0])-x[0] << ")" << endl;
        cout << "\t\t    Jacobian(" << z[0] << ") = " << -sin(z[0]) << endl;
        cout << "\t\tpredJacobian(" << z[0] << ") = " << imleObj.getPredictionJacobian()(0,0) << endl;
    }

    // Inverse Prediction
    cout << "\t --- Inverse Prediction (random output locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        x[0] = uniform(rng) * 2.0 - 1.0;
        Scal inv_x = acos(x[0]);

        imleObj.predictInverse(x);

        vector<Scal> invSol;
        int nSol = imleObj.getNumberOfInverseSolutionsFound();
        for( int k = 0; k < nSol; k++ )
            invSol.push_back( imleObj.getInversePredictions()[k][0] );
        sort(invSol.begin(), invSol.end() );

        cout << "\tinvCos(" << x[0] << ") = ( " << inv_x << ", " << 2.0*M_PI-inv_x << ", " << 2.0*M_PI+inv_x << ", " << 4.0*M_PI-inv_x << " )" << endl;
        cout << "\t  pred(" << x[0] << ") = ( ";
        for( int k = 0; k < nSol; k++ )
            cout << invSol[k] << ", ";
        cout << ")" << endl;
    }
}